

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O2

ustring * dlib::convert_utf8_to_utf32(ustring *__return_storage_ptr__,string *str)

{
  int iVar1;
  undefined8 *puVar2;
  unichar ch;
  istringstream sin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)&sin,(string *)str,_S_in);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,str->_M_string_length);
  while( true ) {
    iVar1 = unicode_helpers::u8_to_u32<unsigned_int>(&ch,(istream *)&sin);
    if (iVar1 < 1) break;
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    push_back(__return_storage_ptr__,ch);
  }
  if (-1 < iVar1) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&sin);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  puVar2[1] = puVar2 + 3;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  *(undefined4 *)(puVar2 + 5) = 0x1f;
  *puVar2 = &PTR__error_00337218;
  __cxa_throw(puVar2,&invalid_utf8_error::typeinfo,error::~error);
}

Assistant:

inline const ustring convert_utf8_to_utf32 (
        const std::string& str
    )
    {
        using namespace unicode_helpers;
        ustring temp;
        std::istringstream sin(str);

        temp.reserve(str.size());

        int status;
        unichar ch;
        while ( (status = u8_to_u32(ch,sin)) > 0)
            temp.push_back(ch);

        if (status < 0)
            throw invalid_utf8_error();

        return temp;
    }